

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

AssertionResult testing::AssertionFailure(Message *message)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult *in_RSI;
  undefined8 in_RDI;
  AssertionResult AVar1;
  Message *in_stack_ffffffffffffffd8;
  AssertionResult *in_stack_ffffffffffffffe0;
  AssertionResult *in_stack_ffffffffffffffe8;
  
  AssertionFailure();
  AssertionResult::operator<<(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  AssertionResult::AssertionResult(in_RSI,in_stack_ffffffffffffffe8);
  AssertionResult::~AssertionResult((AssertionResult *)0x1637db);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = in_RDI;
  return AVar1;
}

Assistant:

AssertionResult AssertionFailure(const Message& message) {
  return AssertionFailure() << message;
}